

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O1

int csp_id_is_broadcast(uint16_t addr,csp_iface_t *iface)

{
  sbyte sVar1;
  undefined2 in_register_0000003a;
  uint uVar2;
  
  sVar1 = (csp_conf.version == '\x02') * '\t' + 5;
  uVar2 = ~(-1 << (sVar1 - (char)iface->netmask & 0x1fU)) & 0xffff;
  if (((uVar2 & ~CONCAT22(in_register_0000003a,addr)) == 0) &&
     ((~(-1 << sVar1) - uVar2 & (uint)(iface->addr ^ addr)) == 0)) {
    return 1;
  }
  uVar2 = 0x1f;
  if (csp_conf.version == '\x02') {
    uVar2 = 0x3fff;
  }
  return (uint)(uVar2 == CONCAT22(in_register_0000003a,addr));
}

Assistant:

int csp_id_is_broadcast(uint16_t addr, csp_iface_t * iface) {
	uint16_t hostmask = (1 << (csp_id_get_host_bits() - iface->netmask)) - 1;
	uint16_t netmask = (1 << csp_id_get_host_bits()) - 1 - hostmask;
	if (((addr & hostmask) == hostmask) && ((addr & netmask) == (iface->addr & netmask))) {
		return 1;
	}

	if (addr == csp_id_get_max_nodeid()) {
		return 1;
	}
	return 0;
}